

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall xatlas::internal::segment::Atlas::isNormalSeam(Atlas *this,uint32_t edge)

{
  uint uVar1;
  Mesh *pMVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Vector3 *pVVar8;
  Vector3 *pVVar9;
  uint *puVar10;
  byte local_61;
  uint32_t f1;
  uint32_t f0;
  uint32_t ov1;
  uint32_t ov0;
  uint32_t v1;
  uint32_t v0;
  uint32_t oppositeEdge;
  uint32_t edge_local;
  Atlas *this_local;
  
  uVar4 = Mesh::oppositeEdge(this->m_mesh,edge);
  if (uVar4 == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else {
    uVar5 = Mesh::flags(this->m_mesh);
    if ((uVar5 & 4) == 0) {
      uVar5 = meshEdgeFace(edge);
      uVar4 = meshEdgeFace(uVar4);
      puVar10 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,uVar5);
      uVar1 = *puVar10;
      puVar10 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,uVar4);
      if (uVar1 == *puVar10) {
        this_local._7_1_ = false;
      }
      else {
        pVVar8 = Array<xatlas::internal::Vector3>::operator[](&this->m_faceNormals,uVar5);
        pVVar9 = Array<xatlas::internal::Vector3>::operator[](&this->m_faceNormals,uVar4);
        bVar3 = equal(pVVar8,pVVar9,0.001);
        this_local._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
      }
    }
    else {
      pMVar2 = this->m_mesh;
      uVar5 = meshEdgeIndex0(edge);
      uVar5 = Mesh::vertexAt(pMVar2,uVar5);
      pMVar2 = this->m_mesh;
      uVar6 = meshEdgeIndex1(edge);
      uVar6 = Mesh::vertexAt(pMVar2,uVar6);
      pMVar2 = this->m_mesh;
      uVar7 = meshEdgeIndex0(uVar4);
      uVar7 = Mesh::vertexAt(pMVar2,uVar7);
      pMVar2 = this->m_mesh;
      uVar4 = meshEdgeIndex1(uVar4);
      uVar4 = Mesh::vertexAt(pMVar2,uVar4);
      if ((uVar5 == uVar4) && (uVar6 == uVar7)) {
        this_local._7_1_ = false;
      }
      else {
        pVVar8 = Mesh::normal(this->m_mesh,uVar5);
        pVVar9 = Mesh::normal(this->m_mesh,uVar4);
        bVar3 = equal(pVVar8,pVVar9,0.001);
        local_61 = 1;
        if (bVar3) {
          pVVar8 = Mesh::normal(this->m_mesh,uVar6);
          pVVar9 = Mesh::normal(this->m_mesh,uVar7);
          bVar3 = equal(pVVar8,pVVar9,0.001);
          local_61 = bVar3 ^ 0xff;
        }
        this_local._7_1_ = (bool)(local_61 & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool isNormalSeam(uint32_t edge) const
	{
		const uint32_t oppositeEdge = m_mesh->oppositeEdge(edge);
		if (oppositeEdge == UINT32_MAX)
			return false; // boundary edge
		if (m_mesh->flags() & MeshFlags::HasNormals) {
			const uint32_t v0 = m_mesh->vertexAt(meshEdgeIndex0(edge));
			const uint32_t v1 = m_mesh->vertexAt(meshEdgeIndex1(edge));
			const uint32_t ov0 = m_mesh->vertexAt(meshEdgeIndex0(oppositeEdge));
			const uint32_t ov1 = m_mesh->vertexAt(meshEdgeIndex1(oppositeEdge));
			if (v0 == ov1 && v1 == ov0)
				return false;
			return !equal(m_mesh->normal(v0), m_mesh->normal(ov1), kNormalEpsilon) || !equal(m_mesh->normal(v1), m_mesh->normal(ov0), kNormalEpsilon);
		}
		const uint32_t f0 = meshEdgeFace(edge);
		const uint32_t f1 = meshEdgeFace(oppositeEdge);
		if (m_facePlanarRegionId[f0] == m_facePlanarRegionId[f1])
			return false;
		return !equal(m_faceNormals[f0], m_faceNormals[f1], kNormalEpsilon);
	}